

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e)

{
  int iVar1;
  TEdge *pTVar2;
  TEdge *pTVar3;
  TEdge *pTVar4;
  clipperException *this_00;
  TEdge *pTVar5;
  TEdge **ppTVar6;
  bool bVar7;
  
  pTVar3 = GetMaximaPairEx(e);
  if (pTVar3 == (TEdge *)0x0) {
    if (-1 < e->OutIdx) {
      AddOutPt(this,e,&e->Top);
    }
    pTVar4 = e->NextInAEL;
    pTVar5 = e->PrevInAEL;
    if (((pTVar5 == (TEdge *)0x0) && (pTVar4 == (TEdge *)0x0)) &&
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != e)) {
      return;
    }
    ppTVar6 = &e->NextInAEL;
    pTVar3 = pTVar5;
    if (pTVar5 == (TEdge *)0x0) {
      pTVar3 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
    }
    pTVar3->NextInAEL = pTVar4;
    goto LAB_00113206;
  }
  pTVar4 = e->NextInAEL;
  bVar7 = pTVar4 != (TEdge *)0x0;
  if (pTVar4 != pTVar3 && bVar7) {
    do {
      IntersectEdges(this,e,pTVar4,&e->Top);
      ClipperBase::SwapPositionsInAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),e,
                 pTVar4);
      pTVar4 = e->NextInAEL;
      bVar7 = pTVar4 != (TEdge *)0x0;
      if (pTVar4 == (TEdge *)0x0) break;
    } while (pTVar4 != pTVar3);
  }
  iVar1 = e->OutIdx;
  if ((iVar1 == -1) && (pTVar3->OutIdx == -1)) {
    pTVar5 = e->PrevInAEL;
    if (((bool)(pTVar5 != (TEdge *)0x0 | bVar7)) ||
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) == e)) {
      pTVar2 = pTVar5;
      if (pTVar5 == (TEdge *)0x0) {
        pTVar2 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      }
      pTVar2->NextInAEL = pTVar4;
      if (bVar7) {
        pTVar4->PrevInAEL = pTVar5;
      }
LAB_001131c2:
      e->NextInAEL = (TEdge *)0x0;
      e->PrevInAEL = (TEdge *)0x0;
    }
  }
  else if ((iVar1 < 0) || (pTVar3->OutIdx < 0)) {
    if (e->WindDelta != 0) {
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
      __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
    }
    if (-1 < iVar1) {
      AddOutPt(this,e,&e->Top);
      e->OutIdx = -1;
    }
    pTVar4 = e->NextInAEL;
    pTVar5 = e->PrevInAEL;
    if (((pTVar5 != (TEdge *)0x0) || (pTVar4 != (TEdge *)0x0)) ||
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) == e)) {
      pTVar2 = pTVar5;
      if (pTVar5 == (TEdge *)0x0) {
        pTVar2 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      }
      pTVar2->NextInAEL = pTVar4;
      if (pTVar4 != (TEdge *)0x0) {
        pTVar4->PrevInAEL = pTVar5;
      }
      e->NextInAEL = (TEdge *)0x0;
      e->PrevInAEL = (TEdge *)0x0;
    }
    if (-1 < pTVar3->OutIdx) {
      AddOutPt(this,pTVar3,&e->Top);
      pTVar3->OutIdx = -1;
    }
  }
  else {
    AddLocalMaxPoly(this,e,pTVar3,&e->Top);
    pTVar4 = e->NextInAEL;
    pTVar5 = e->PrevInAEL;
    if (((pTVar5 != (TEdge *)0x0) || (pTVar4 != (TEdge *)0x0)) ||
       (*(TEdge **)
         (this->_vptr_Clipper[-3] + 0x10 +
         (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) == e)) {
      pTVar2 = pTVar5;
      if (pTVar5 == (TEdge *)0x0) {
        pTVar2 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
      }
      pTVar2->NextInAEL = pTVar4;
      if (pTVar4 != (TEdge *)0x0) {
        pTVar4->PrevInAEL = pTVar5;
      }
      goto LAB_001131c2;
    }
  }
  pTVar4 = pTVar3->NextInAEL;
  pTVar5 = pTVar3->PrevInAEL;
  if (((pTVar5 == (TEdge *)0x0) && (pTVar4 == (TEdge *)0x0)) &&
     (*(TEdge **)
       (this->_vptr_Clipper[-3] + 0x10 +
       (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) != pTVar3))
  {
    return;
  }
  ppTVar6 = &pTVar3->NextInAEL;
  pTVar3 = pTVar5;
  if (pTVar5 == (TEdge *)0x0) {
    pTVar3 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
  }
  pTVar3->NextInAEL = pTVar4;
LAB_00113206:
  if (pTVar4 != (TEdge *)0x0) {
    pTVar4->PrevInAEL = pTVar5;
  }
  *ppTVar6 = (TEdge *)0x0;
  ppTVar6[1] = (TEdge *)0x0;
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e)
{
  TEdge* eMaxPair = GetMaximaPairEx(e);
  if (!eMaxPair)
  {
    if (e->OutIdx >= 0)
      AddOutPt(e, e->Top);
    DeleteFromAEL(e);
    return;
  }

  TEdge* eNext = e->NextInAEL;
  while(eNext && eNext != eMaxPair)
  {
    IntersectEdges(e, eNext, e->Top);
    SwapPositionsInAEL(e, eNext);
    eNext = e->NextInAEL;
  }

  if(e->OutIdx == Unassigned && eMaxPair->OutIdx == Unassigned)
  {
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
  else if( e->OutIdx >= 0 && eMaxPair->OutIdx >= 0 )
  {
    if (e->OutIdx >= 0) AddLocalMaxPoly(e, eMaxPair, e->Top);
    DeleteFromAEL(e);
    DeleteFromAEL(eMaxPair);
  }
#ifdef use_lines
  else if (e->WindDelta == 0)
  {
    if (e->OutIdx >= 0) 
    {
      AddOutPt(e, e->Top);
      e->OutIdx = Unassigned;
    }
    DeleteFromAEL(e);

    if (eMaxPair->OutIdx >= 0)
    {
      AddOutPt(eMaxPair, e->Top);
      eMaxPair->OutIdx = Unassigned;
    }
    DeleteFromAEL(eMaxPair);
  } 
#endif
  else throw clipperException("DoMaxima error");
}